

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

bool __thiscall cmDependsFortran::FindModule(cmDependsFortran *this,string *name,string *module)

{
  pointer pcVar1;
  bool bVar2;
  pointer pbVar3;
  bool bVar4;
  string mod_lower;
  string fullName;
  string mod_upper;
  long *local_98 [2];
  long local_88 [2];
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  string *local_58;
  string local_50;
  
  cmsys::SystemTools::UpperCase(&local_50,name);
  local_98[0] = local_88;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar1,pcVar1 + name->_M_string_length);
  local_58 = module;
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::append((char *)local_98);
  local_70 = 0;
  local_68 = '\0';
  pbVar3 = (this->super_cmDepends).IncludePath.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = pbVar3 != (this->super_cmDepends).IncludePath.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = &local_68;
  if (bVar4) {
    do {
      std::__cxx11::string::_M_assign((string *)&local_78);
      std::__cxx11::string::append((char *)&local_78);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98[0]);
      bVar2 = cmsys::SystemTools::FileExists(local_78,true);
      if (bVar2) {
LAB_0043ba77:
        std::__cxx11::string::_M_assign((string *)local_58);
        break;
      }
      std::__cxx11::string::_M_assign((string *)&local_78);
      std::__cxx11::string::append((char *)&local_78);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
      bVar2 = cmsys::SystemTools::FileExists(local_78,true);
      if (bVar2) goto LAB_0043ba77;
      pbVar3 = pbVar3 + 1;
      bVar4 = pbVar3 != (this->super_cmDepends).IncludePath.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    } while (bVar4);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmDependsFortran::FindModule(std::string const& name, std::string& module)
{
  // Construct possible names for the module file.
  std::string mod_upper = cmSystemTools::UpperCase(name);
  std::string mod_lower = name;
  mod_upper += ".mod";
  mod_lower += ".mod";

  // Search the include path for the module.
  std::string fullName;
  for (std::vector<std::string>::const_iterator i = this->IncludePath.begin();
       i != this->IncludePath.end(); ++i) {
    // Try the lower-case name.
    fullName = *i;
    fullName += "/";
    fullName += mod_lower;
    if (cmSystemTools::FileExists(fullName.c_str(), true)) {
      module = fullName;
      return true;
    }

    // Try the upper-case name.
    fullName = *i;
    fullName += "/";
    fullName += mod_upper;
    if (cmSystemTools::FileExists(fullName.c_str(), true)) {
      module = fullName;
      return true;
    }
  }
  return false;
}